

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_2dVector::Unitize(ON_2dVector *this)

{
  double dVar1;
  undefined1 local_30 [8];
  ON_2dVector tmp;
  double d;
  ON_2dVector *this_local;
  
  dVar1 = Length(this);
  tmp.y._6_2_ = (ushort)((ulong)dVar1 >> 0x30);
  if ((tmp.y._6_2_ & 0x7ff0) != 0x7ff0) {
    if (2.2250738585072014e-308 < dVar1) {
      this->x = this->x / dVar1;
      this->y = this->y / dVar1;
      return true;
    }
    if (0.0 < dVar1) {
      local_30 = (undefined1  [8])(this->x * 8.98846567431158e+307);
      tmp.x = this->y * 8.98846567431158e+307;
      tmp.y = dVar1;
      dVar1 = Length((ON_2dVector *)local_30);
      tmp.y._6_2_ = (ushort)((ulong)dVar1 >> 0x30);
      if (((tmp.y._6_2_ & 0x7ff0) != 0x7ff0) && (2.2250738585072014e-308 < dVar1)) {
        this->x = (double)local_30 / dVar1;
        this->y = tmp.x / dVar1;
        return true;
      }
    }
  }
  this->x = 0.0;
  this->y = 0.0;
  return false;
}

Assistant:

bool ON_2dVector::Unitize()
{
  // 15 September 2003 Dale Lear
  //     Added the ON_IS_FINITE and ON_DBL_MIN test.  See ON_2dVector::Length()
  //     for details.
  double d = Length();
  if ( ON_IS_FINITE(d) )
  {
    if ( d > ON_DBL_MIN ) 
    {
      x /= d;
      y /= d;
      return true;
    }
    
    if ( d > 0.0 )
    {
      // This code is rarely used and can be slow.
      // It multiplies by 2^1023 in an attempt to 
      // normalize the coordinates.
      // If the renormalization works, then we're
      // ok.  If the renormalization fails, we
      // return false.
      ON_2dVector tmp;
      tmp.x = x*8.9884656743115795386465259539451e+307;
      tmp.y = y*8.9884656743115795386465259539451e+307;
      d = tmp.Length();
      if ( ON_IS_FINITE(d) && d > ON_DBL_MIN )
      {
        x = tmp.x/d;
        y = tmp.y/d;
        return true;
      }
    }
  }

  x = 0.0;
  y = 0.0;

  return false;
}